

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O2

char * __thiscall
CNscContext::ReplaceToken(CNscContext *this,char *pszToken,int *nCount,string *pstrNewToken)

{
  ulong __n;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  _Var1;
  bool bVar2;
  reference rVar3;
  char *local_80;
  key_type local_68;
  ReplacedDefineBitmap cReplacedDefines;
  
  if ((this->m_cDefines).
      super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_cDefines).
      super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_68.nLength = (size_t)*nCount;
    local_68.psz = pszToken;
    _Var1._M_cur = (__node_type *)
                   std::
                   _Hashtable<CNscContext::FastHashMapStr,_std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<CNscContext::FastHashMapStr>,_CNscContext::FastHashMapStrHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->m_cDefineLookup)._M_h,&local_68);
    if (_Var1._M_cur != (__node_type *)0x0) {
      cReplacedDefines.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      cReplacedDefines.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      cReplacedDefines.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      cReplacedDefines.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      cReplacedDefines.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&cReplacedDefines,
                 (long)(this->m_cDefines).
                       super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_cDefines).
                       super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,false);
      bVar2 = false;
      do {
        __n = **(ulong **)
                ((long)&((_Var1._M_cur)->
                        super__Hash_node_value<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>
                        ._M_storage._M_storage + 0x10);
        if ((ulong)((long)(this->m_cDefines).
                          super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_cDefines).
                          super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
          __assert_fail("nDefineIndex < m_cDefines .size ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                        ,0xa72,"char *CNscContext::ReplaceToken(char *, int *, std::string *)");
        }
        rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&cReplacedDefines,__n);
        if ((*rVar3._M_p & rVar3._M_mask) != 0) {
          local_80 = pszToken;
          if (!bVar2) goto LAB_001525d2;
          break;
        }
        rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&cReplacedDefines,__n);
        *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
        GetDefineValue_abi_cxx11_
                  (this,*(DefineEntry **)
                         ((long)&((_Var1._M_cur)->
                                 super__Hash_node_value<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>
                                 ._M_storage._M_storage + 0x10),true);
        std::__cxx11::string::_M_assign((string *)pstrNewToken);
        local_68.psz = (pstrNewToken->_M_dataplus)._M_p;
        local_68.nLength = pstrNewToken->_M_string_length;
        _Var1._M_cur = (__node_type *)
                       std::
                       _Hashtable<CNscContext::FastHashMapStr,_std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<CNscContext::FastHashMapStr>,_CNscContext::FastHashMapStrHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->m_cDefineLookup)._M_h,&local_68);
        bVar2 = true;
      } while (_Var1._M_cur != (__node_type *)0x0);
      *nCount = (int)pstrNewToken->_M_string_length;
      local_80 = (pstrNewToken->_M_dataplus)._M_p;
LAB_001525d2:
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&cReplacedDefines.super__Bvector_base<std::allocator<bool>_>);
      pszToken = local_80;
    }
  }
  return pszToken;
}

Assistant:

char *CNscContext::ReplaceToken (char *pszToken, int *nCount,
	std::string *pstrNewToken)
{
	typedef std::vector <bool> ReplacedDefineBitmap;

	//
	// If we have no defines then just pass through
	//

	if (m_cDefines .empty ())
		return pszToken;

	//
	// Get us out of the common path (no match) as quick as possible
	//

	FastHashMapStr sLookup (pszToken, *nCount);
	DefineLookupMap::const_iterator it = m_cDefineLookup .find (sLookup);

	if (it == m_cDefineLookup .end ())
		return pszToken;

	ReplacedDefineBitmap cReplacedDefines;
	size_t nDefineIndex;
	bool fReplacedAnyToken = false;

	cReplacedDefines .resize (m_cDefines .size ());

	//
	// Loop until we haven't replaced any defines in one iteration
	//

	for (;;)
	{
		//
		// If we have already replaced this define
		//

		nDefineIndex = it ->second ->nId;

		assert (nDefineIndex < m_cDefines .size ());

		if (cReplacedDefines [nDefineIndex])
			break;

		//
		// Mark the define as replaced in the bitmap
		//

		cReplacedDefines [nDefineIndex] = true;
		fReplacedAnyToken = true;

		//
		// Substitute it
		//

		*pstrNewToken = *GetDefineValue (it ->second);
		sLookup = *pstrNewToken;

		it = m_cDefineLookup .find (sLookup);

		if (it == m_cDefineLookup .end ())
			break;
	}

	if (!fReplacedAnyToken)
		return pszToken;

	*nCount = (int) pstrNewToken ->size ();
	return (char *) pstrNewToken ->c_str ();
}